

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::TextureFilterMinmaxSupportTestCase::iterate(TextureFilterMinmaxSupportTestCase *this)

{
  SupportedTextureType *pSVar1;
  bool bVar2;
  int iVar3;
  GLenum GVar4;
  deUint32 err;
  deBool dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
  *pvVar7;
  reference ppSVar8;
  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
  *pvVar9;
  pointer pSVar10;
  TestError *this_00;
  int local_4c;
  const_iterator cStack_48;
  GLint params;
  __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
  local_40;
  SupportedTextureDataTypeIter dataTypeIter;
  SupportedTextureType *textureType;
  __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
  local_28;
  SupportedTextureTypeIter textureTypeIter;
  Functions *gl;
  RenderContext *renderContext;
  TextureFilterMinmaxSupportTestCase *this_local;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar6->_vptr_RenderContext[3])();
  textureTypeIter._M_current = (SupportedTextureType **)CONCAT44(extraout_var,iVar3);
  pvVar7 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
  local_28._M_current =
       (SupportedTextureType **)
       std::
       vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
       ::begin(pvVar7);
  do {
    pvVar7 = TextureFilterMinmaxUtils::getSupportedTextureTypes(&this->m_utils);
    textureType = (SupportedTextureType *)
                  std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>
                  ::end(pvVar7);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
                        *)&textureType);
    if (!bVar2) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      return STOP;
    }
    ppSVar8 = __gnu_cxx::
              __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
              ::operator*(&local_28);
    dataTypeIter._M_current = (SupportedTextureDataType *)*ppSVar8;
    pvVar9 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
    local_40._M_current =
         (SupportedTextureDataType *)
         std::
         vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
         ::begin(pvVar9);
    while( true ) {
      pvVar9 = TextureFilterMinmaxUtils::getSupportedTextureDataTypes(&this->m_utils);
      cStack_48 = std::
                  vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>
                  ::end(pvVar9);
      bVar2 = __gnu_cxx::operator!=(&local_40,&stack0xffffffffffffffb8);
      if (!bVar2) break;
      local_4c = 0;
      pSVar1 = textureTypeIter._M_current[0x110];
      GVar4 = TextureFilterMinmaxUtils::SupportedTextureType::getType
                        ((SupportedTextureType *)dataTypeIter._M_current);
      pSVar10 = __gnu_cxx::
                __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
                ::operator->(&local_40);
      (*(code *)pSVar1)(GVar4,pSVar10->m_format,0x9366,4,&local_4c);
      err = (*(code *)textureTypeIter._M_current[0x100])();
      glu::checkError(err,"getInternalformativ() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                      ,0x311);
      do {
        dVar5 = ::deGetFalse();
        if ((dVar5 != 0) || (local_4c == 0)) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"GetInternalformativ incorrect value","params",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureFilterMinmaxTests.cpp"
                     ,0x312);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      __gnu_cxx::
      __normal_iterator<const_gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureDataType>_>_>
      ::operator++(&local_40);
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*const_*,_std::vector<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*,_std::allocator<gl4cts::TextureFilterMinmaxUtils::SupportedTextureType_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureFilterMinmaxSupportTestCase::iterate()
{
	const glu::RenderContext& renderContext = m_context.getRenderContext();
	const glw::Functions&	 gl			= renderContext.getFunctions();

	for (TextureFilterMinmaxUtils::SupportedTextureTypeIter textureTypeIter =
			 m_utils.getSupportedTextureTypes().begin();
		 textureTypeIter != m_utils.getSupportedTextureTypes().end(); ++textureTypeIter)
	{
		TextureFilterMinmaxUtils::SupportedTextureType* textureType = *textureTypeIter;

		for (TextureFilterMinmaxUtils::SupportedTextureDataTypeIter dataTypeIter =
				 m_utils.getSupportedTextureDataTypes().begin();
			 dataTypeIter != m_utils.getSupportedTextureDataTypes().end(); ++dataTypeIter)
		{
			glw::GLint params = 0;
			gl.getInternalformativ(textureType->getType(), dataTypeIter->m_format, GL_TEXTURE_REDUCTION_MODE_ARB,
								   sizeof(glw::GLint), &params);
			GLU_EXPECT_NO_ERROR(gl.getError(), "getInternalformativ() call failed.");
			TCU_CHECK_MSG(params, "GetInternalformativ incorrect value");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}